

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13ccb4::PluralTableSink::put
          (PluralTableSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString local_a0;
  int local_60;
  int32_t local_5c;
  int32_t index;
  int32_t i;
  ResourceTable pluralsTable;
  UErrorCode *status_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  PluralTableSink *this_local;
  
  pluralsTable._32_8_ = status;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(&index,value,status);
  UVar1 = ::U_FAILURE(*(UErrorCode *)pluralsTable._32_8_);
  if (UVar1 == '\0') {
    local_5c = 0;
    while (UVar1 = icu_63::ResourceTable::getKeyAndValue
                             ((ResourceTable *)&index,local_5c,(char **)&value_local,value),
          UVar1 != '\0') {
      local_60 = getIndex((char *)value_local,(UErrorCode *)pluralsTable._32_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)pluralsTable._32_8_);
      if (UVar1 != '\0') {
        return;
      }
      UVar1 = icu_63::UnicodeString::isBogus(this->outArray + local_60);
      if (UVar1 != '\0') {
        icu_63::ResourceValue::getUnicodeString(&local_a0,value,(UErrorCode *)pluralsTable._32_8_);
        icu_63::UnicodeString::operator=(this->outArray + local_60,&local_a0);
        icu_63::UnicodeString::~UnicodeString(&local_a0);
        UVar1 = ::U_FAILURE(*(UErrorCode *)pluralsTable._32_8_);
        if (UVar1 != '\0') {
          return;
        }
      }
      local_5c = local_5c + 1;
    }
  }
  return;
}

Assistant:

void put(const char *key, ResourceValue &value, UBool /*noFallback*/, UErrorCode &status) U_OVERRIDE {
        ResourceTable pluralsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int32_t i = 0; pluralsTable.getKeyAndValue(i, key, value); ++i) {
            int32_t index = getIndex(key, status);
            if (U_FAILURE(status)) { return; }
            if (!outArray[index].isBogus()) {
                continue;
            }
            outArray[index] = value.getUnicodeString(status);
            if (U_FAILURE(status)) { return; }
        }
    }